

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O3

void __thiscall baryonyx::bit_array_impl::bit_array_impl(bit_array_impl *this,int size)

{
  size_t __n;
  int iVar1;
  unsigned_long *__s;
  ulong __n_00;
  
  this->m_size = size;
  iVar1 = size + 0x3f;
  if (-1 < size) {
    iVar1 = size;
  }
  __n = (long)(iVar1 >> 6) * 8 + 8;
  this->m_block_size = (iVar1 >> 6) + 1;
  __n_00 = 0xffffffffffffffff;
  if (-0x80 < size) {
    __n_00 = __n;
  }
  __s = (unsigned_long *)operator_new__(__n_00);
  memset(__s,0,__n_00);
  (this->m_data)._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __s;
  if (size < -0x3f) {
    return;
  }
  memset(__s,0,__n);
  return;
}

Assistant:

bit_array_impl(int size)
      : m_size(size)
      , m_block_size((m_size / bit_per_block) + 1)
      , m_data(std::make_unique<underlying_type[]>(m_block_size))
    {
        std::fill_n(m_data.get(), m_block_size, k_zeros);
    }